

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vic20.cpp
# Opt level: O0

bool __thiscall Commodore::Vic20::ConcreteMachine::insert_media(ConcreteMachine *this,Media *media)

{
  pointer *this_00;
  bool bVar1;
  element_type *this_01;
  const_reference pvVar2;
  element_type *this_02;
  const_reference pvVar3;
  __shared_ptr_access<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_03;
  element_type *this_04;
  vector<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
  *this_05;
  const_reference pvVar4;
  size_type sVar5;
  uchar *area;
  byte local_99;
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> rom_image;
  shared_ptr<Storage::Tape::Tape> local_28;
  Media *local_18;
  Media *media_local;
  ConcreteMachine *this_local;
  
  local_18 = media;
  media_local = (Media *)this;
  bVar1 = std::
          vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
          ::empty(&media->tapes);
  if (!bVar1) {
    this_01 = std::
              __shared_ptr_access<Storage::Tape::BinaryTapePlayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Storage::Tape::BinaryTapePlayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->tape_);
    pvVar2 = std::
             vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
             ::front(&local_18->tapes);
    std::shared_ptr<Storage::Tape::Tape>::shared_ptr(&local_28,pvVar2);
    Storage::Tape::TapePlayer::set_tape(&this_01->super_TapePlayer,&local_28);
    std::shared_ptr<Storage::Tape::Tape>::~shared_ptr(&local_28);
  }
  bVar1 = std::
          vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
          ::empty(&local_18->disks);
  if ((!bVar1) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->c1540_), bVar1)) {
    this_02 = std::
              __shared_ptr_access<Commodore::C1540::Machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Commodore::C1540::Machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->c1540_);
    pvVar3 = std::
             vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
             ::front(&local_18->disks);
    this_00 = &rom_image.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::shared_ptr<Storage::Disk::Disk>::shared_ptr
              ((shared_ptr<Storage::Disk::Disk> *)this_00,pvVar3);
    C1540::Machine::set_disk(this_02,(shared_ptr<Storage::Disk::Disk> *)this_00);
    std::shared_ptr<Storage::Disk::Disk>::~shared_ptr
              ((shared_ptr<Storage::Disk::Disk> *)
               &rom_image.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  bVar1 = std::
          vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
          ::empty(&local_18->cartridges);
  if (!bVar1) {
    this->rom_address_ = 0xa000;
    this_03 = (__shared_ptr_access<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                 ::front(&local_18->cartridges);
    this_04 = std::
              __shared_ptr_access<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_03);
    this_05 = Storage::Cartridge::Cartridge::get_segments(this_04);
    pvVar4 = std::
             vector<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
             ::front(this_05);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,&pvVar4->data);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
    this->rom_length_ = (uint16_t)sVar5;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->rom_,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->rom_,0x2000);
    area = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->rom_);
    write_to_map(this,this->processor_read_memory_map_,area,this->rom_address_,this->rom_length_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  }
  set_use_fast_tape(this);
  bVar1 = std::
          vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
          ::empty(&local_18->tapes);
  local_99 = 1;
  if (bVar1) {
    bVar1 = std::
            vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
            ::empty(&local_18->disks);
    if (!bVar1) {
      bVar1 = std::operator!=(&this->c1540_,(nullptr_t)0x0);
      local_99 = 1;
      if (bVar1) goto LAB_007024dc;
    }
    bVar1 = std::
            vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
            ::empty(&local_18->cartridges);
    local_99 = bVar1 ^ 0xff;
  }
LAB_007024dc:
  return (bool)(local_99 & 1);
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(!media.tapes.empty()) {
				tape_->set_tape(media.tapes.front());
			}

			if(!media.disks.empty() && c1540_) {
				c1540_->set_disk(media.disks.front());
			}

			if(!media.cartridges.empty()) {
				rom_address_ = 0xa000;
				std::vector<uint8_t> rom_image = media.cartridges.front()->get_segments().front().data;
				rom_length_ = uint16_t(rom_image.size());

				rom_ = rom_image;
				rom_.resize(0x2000);
				write_to_map(processor_read_memory_map_, rom_.data(), rom_address_, rom_length_);
			}

			set_use_fast_tape();

			return !media.tapes.empty() || (!media.disks.empty() && c1540_ != nullptr) || !media.cartridges.empty();
		}